

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O0

void mpp_show_color_format(void)

{
  MppFrameFormatInfo *info;
  RK_U32 i;
  
  _mpp_log_l(4,"mpi","mpp color support list:",(char *)0x0);
  for (info._4_4_ = 0; info._4_4_ < 0x17; info._4_4_ = info._4_4_ + 1) {
    _mpp_log_l(4,"mpi","color: id %-5d 0x%05x %s\n",(char *)0x0,(ulong)color_list[info._4_4_].format
               ,(ulong)color_list[info._4_4_].format,color_list[info._4_4_].name);
  }
  return;
}

Assistant:

void mpp_show_color_format()
{
    RK_U32 i = 0;

    mpp_log("mpp color support list:");

    for (i = 0; i < MPP_ARRAY_ELEMS(color_list); i++) {
        MppFrameFormatInfo *info = &color_list[i];
        mpp_log("color: id %-5d 0x%05x %s\n",
                info->format, info->format, info->name);
    }
}